

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::OneofDescriptorProto::ByteSizeLong(OneofDescriptorProto *this)

{
  long lVar1;
  int iVar2;
  anon_union_24_1_493b367e_for_OneofDescriptorProto_3 aVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  
  aVar3 = this->field_0;
  if (((undefined1  [24])aVar3 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar6 = 0;
  }
  else {
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar6 = 0;
    }
    else {
      lVar1 = *(long *)(((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                       + 8);
      uVar4 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [24])aVar3 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar5 = OneofOptions::ByteSizeLong((this->field_0)._impl_.options_);
      uVar4 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t OneofDescriptorProto::ByteSizeLong() const {
  const OneofDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.OneofDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.OneofOptions options = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}